

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rate2.cpp
# Opt level: O0

STAmount *
jbcoin::divideRound(STAmount *__return_storage_ptr__,STAmount *amount,Rate *rate,Issue *issue,
                   bool roundUp)

{
  Rate *num;
  bool bVar1;
  STAmount local_78;
  byte local_29;
  Issue *pIStack_28;
  bool roundUp_local;
  Issue *issue_local;
  Rate *rate_local;
  STAmount *amount_local;
  
  local_29 = roundUp;
  pIStack_28 = issue;
  issue_local = (Issue *)rate;
  rate_local = (Rate *)amount;
  amount_local = __return_storage_ptr__;
  if (rate->value != 0) {
    bVar1 = operator==(rate,(Rate *)&parityRate);
    num = rate_local;
    if (bVar1) {
      STAmount::STAmount(__return_storage_ptr__,(STAmount *)rate_local);
    }
    else {
      detail::as_amount(&local_78,(Rate *)issue_local);
      divRound(__return_storage_ptr__,(STAmount *)num,&local_78,pIStack_28,(bool)(local_29 & 1));
      STAmount::~STAmount(&local_78);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("rate.value != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/Rate2.cpp"
                ,0x85,
                "STAmount jbcoin::divideRound(const STAmount &, const Rate &, const Issue &, bool)")
  ;
}

Assistant:

STAmount
divideRound (
    STAmount const& amount,
    Rate const& rate,
    Issue const& issue,
    bool roundUp)
{
    assert (rate.value != 0);

    if (rate == parityRate)
        return amount;

    return divRound (
        amount,
        detail::as_amount(rate),
        issue,
        roundUp);
}